

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_compress2(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len,int level)

{
  ulong in_RCX;
  mz_streamp in_RDX;
  ulong *in_RSI;
  mz_stream stream;
  int status;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff84;
  mz_streamp in_stack_ffffffffffffff88;
  int local_4;
  
  memset(&stack0xffffffffffffff60,0,0x70);
  if ((in_RCX | *in_RSI) < 0x100000000) {
    local_4 = mz_deflateInit(in_RDX,in_stack_ffffffffffffff5c);
    if (local_4 == 0) {
      local_4 = mz_deflate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      if (local_4 == 1) {
        *in_RSI = (ulong)in_stack_ffffffffffffff88;
        local_4 = mz_deflateEnd((mz_streamp)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        mz_deflateEnd((mz_streamp)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (local_4 == 0) {
          local_4 = -5;
        }
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int mz_compress2(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource, mz_ulong source_len, int level)
{
  int status;
  mz_stream stream;
  memset(&stream, 0, sizeof(stream));

  // In case mz_ulong is 64-bits (argh I hate longs).
  if ((source_len | *pDest_len) > 0xFFFFFFFFU) return MZ_PARAM_ERROR;

  stream.next_in = pSource;
  stream.avail_in = (mz_uint32)source_len;
  stream.next_out = pDest;
  stream.avail_out = (mz_uint32)*pDest_len;

  status = mz_deflateInit(&stream, level);
  if (status != MZ_OK) return status;

  status = mz_deflate(&stream, MZ_FINISH);
  if (status != MZ_STREAM_END)
  {
    mz_deflateEnd(&stream);
    return (status == MZ_OK) ? MZ_BUF_ERROR : status;
  }

  *pDest_len = stream.total_out;
  return mz_deflateEnd(&stream);
}